

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_reboot(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  char *astr;
  long in_RDI;
  __type_conflict2 _Var4;
  string area;
  bool found;
  AREA_DATA_conflict *pArea;
  char arg1 [4608];
  char send [4608];
  int mins;
  char *in_stack_ffffffffffffdb38;
  undefined6 in_stack_ffffffffffffdb40;
  undefined1 in_stack_ffffffffffffdb46;
  undefined1 in_stack_ffffffffffffdb47;
  CHAR_DATA *in_stack_ffffffffffffdb48;
  CHAR_DATA *in_stack_ffffffffffffdb50;
  allocator<char> *__a;
  undefined4 in_stack_ffffffffffffdb78;
  undefined4 in_stack_ffffffffffffdb7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdb80;
  char **in_stack_ffffffffffffdb88;
  char (*in_stack_ffffffffffffdb90) [7];
  allocator<char> local_2449;
  string local_2448 [39];
  byte local_2421;
  AREA_DATA_conflict *local_2420;
  char local_2418 [4552];
  CHAR_DATA *in_stack_ffffffffffffedb0;
  char local_1218 [4432];
  char *in_stack_ffffffffffffff38;
  CHAR_DATA *in_stack_ffffffffffffff40;
  
  local_2420 = (AREA_DATA_conflict *)0x0;
  local_2421 = 0;
  astr = one_argument((char *)CONCAT17(in_stack_ffffffffffffdb47,
                                       CONCAT16(in_stack_ffffffffffffdb46,in_stack_ffffffffffffdb40)
                                      ),in_stack_ffffffffffffdb38);
  iVar3 = atoi(local_2418);
  __a = &local_2449;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffdb80,
             (char *)CONCAT44(in_stack_ffffffffffffdb7c,in_stack_ffffffffffffdb78),__a);
  std::allocator<char>::~allocator(&local_2449);
  local_2420 = area_first;
  do {
    if (local_2420 == (AREA_DATA_conflict *)0x0) {
      bVar2 = str_cmp(astr,"now");
      if (((bVar2) && (bVar2 = str_cmp(local_2418,"now"), bVar2)) && ((local_2421 & 1) != 0)) {
        send_to_char((char *)in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
        std::__cxx11::string::c_str();
        send_to_char((char *)in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
      }
      else if (((rebooting & 1U) == 0) || (iVar3 == -1)) {
        if (((rebooting & 1U) == 0) && (iVar3 < 0)) {
          send_to_char((char *)in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
        }
        else {
          rebooting = true;
          if (iVar3 == 0) {
            reboot_now(in_stack_ffffffffffffdb50);
          }
          else if (iVar3 == -1) {
            sprintf(local_1218,"{R%s has cancelled the reboot.{x",*(undefined8 *)(in_RDI + 0xf0));
            do_immecho(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
            reboot_num = -1;
            rebooting = false;
          }
          else {
            reboot_num = iVar3;
            start_reboot(in_stack_ffffffffffffedb0);
          }
        }
      }
      else {
        send_to_char((char *)in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
      }
      std::__cxx11::string::~string(local_2448);
      return;
    }
    uVar1 = local_2420->area_flags[0];
    _Var4 = std::pow<int,int>(0,0x59293e);
    if ((uVar1 & (long)_Var4) == 0) {
      in_stack_ffffffffffffdb48 = (CHAR_DATA *)local_2420->area_flags[0];
      in_stack_ffffffffffffdb50 = (CHAR_DATA *)std::pow<int,int>(0,0x59297f);
      if (((ulong)in_stack_ffffffffffffdb48 & (long)(double)in_stack_ffffffffffffdb50) != 0)
      goto LAB_005929a4;
    }
    else {
LAB_005929a4:
      local_2421 = 1;
      fmt::v9::sprintf<char[7],char*,char>(in_stack_ffffffffffffdb90,in_stack_ffffffffffffdb88);
      std::__cxx11::string::operator+=(local_2448,(string *)&stack0xffffffffffffdb80);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffdb80);
    }
    local_2420 = local_2420->next;
  } while( true );
}

Assistant:

void do_reboot(CHAR_DATA *ch, char *argument)
{
	int mins = 0;
	char send[MSL];
	char arg1[MSL];
	AREA_DATA *pArea = nullptr;
	bool found = false;

	argument = one_argument(argument, arg1);
	mins = atoi(arg1);

	std::string area = std::string("");
	for (pArea = area_first; pArea != nullptr; pArea = pArea->next)
	{
		if (IS_SET(pArea->area_flags, AREA_CHANGED) || IS_SET(pArea->area_flags, AREA_ADDED))
		{
			found = true;
			area += fmt::sprintf("%24s\n\r", pArea->name);
		}
	}

	if ((str_cmp(argument, "now") && str_cmp(arg1, "now")) && found)
	{
		send_to_char("The following areas have had changes made and need to be saved.  If you want\n\rto override, specify 'now' after your reboot command.\n\r", ch);
		send_to_char(area.c_str(), ch);
		return;
	}

	if (rebooting && mins != -1)
	{
		send_to_char("Someone has already started a reboot.\n\r", ch);
		return;
	}

	if (!rebooting && mins < 0)
	{
		send_to_char("There is no reboot in progress to cancel.\n\r", ch);
		return;
	}

	rebooting = true;

	if (mins == 0)
	{
		reboot_now(ch);
	}
	else if (mins == -1)
	{
		sprintf(send, "{R%s has cancelled the reboot.{x", ch->true_name);
		do_immecho(ch, send);
		reboot_num = -1;
		rebooting = false;
	}
	else
	{
		reboot_num = mins;
		start_reboot(ch);
	}
}